

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t strncat_from_utf8_libarchive2
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t wVar3;
  archive_string *paVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  wchar_t __wc;
  char *__s;
  uint32_t unicode;
  mbstate_t shift_state;
  wchar_t local_44;
  char *local_40;
  mbstate_t local_38;
  
  local_38.__count = 0;
  local_38.__value = (_union_27)0x0;
  paVar4 = archive_string_ensure(as,len + as->length + 1);
  if (paVar4 != (archive_string *)0x0) {
    pcVar7 = as->s;
    __s = pcVar7 + as->length;
    sVar6 = as->buffer_length;
    sVar5 = __ctype_get_mb_cur_max();
    pcVar7 = pcVar7 + ~sVar5 + sVar6;
    do {
      wVar3 = _utf8_to_unicode((uint32_t *)&local_44,(char *)_p,len);
      if (wVar3 == L'\0') {
        as->length = (long)__s - (long)as->s;
        *__s = '\0';
        return L'\0';
      }
      if (__s < pcVar7) {
LAB_0013b178:
        wVar1 = -wVar3;
        if (L'\0' < wVar3) {
          wVar1 = wVar3;
        }
        __wc = L'?';
        if (L'\xffffffff' < wVar3) {
          __wc = local_44;
        }
        _p = (void *)((long)_p + (ulong)(uint)wVar1);
        len = len - (uint)wVar1;
        sVar5 = wcrtomb(__s,__wc,&local_38);
        if ((int)sVar5 == -1) goto LAB_0013b1a7;
        __s = __s + (int)sVar5;
        bVar2 = true;
      }
      else {
        sVar6 = (long)__s - (long)as->s;
        as->length = sVar6;
        paVar4 = archive_string_ensure(as,sVar6 + len * 2 + 1);
        if (paVar4 != (archive_string *)0x0) {
          pcVar7 = as->s;
          __s = pcVar7 + as->length;
          sVar6 = as->buffer_length;
          local_40 = (char *)_p;
          sVar5 = __ctype_get_mb_cur_max();
          pcVar7 = pcVar7 + ~sVar5 + sVar6;
          _p = local_40;
          goto LAB_0013b178;
        }
LAB_0013b1a7:
        bVar2 = false;
      }
    } while (bVar2);
  }
  return L'\xffffffff';
}

Assistant:

static int
strncat_from_utf8_libarchive2(struct archive_string *as,
    const void *_p, size_t len, struct archive_string_conv *sc)
{
	const char *s;
	int n;
	char *p;
	char *end;
	uint32_t unicode;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	(void)sc; /* UNUSED */
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while ((n = _utf8_to_unicode(&unicode, s, len)) != 0) {
		wchar_t wc;

		if (p >= end) {
			as->length = p - as->s;
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + len * 2 + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}

		/*
		 * As libarchie 2.x, translates the UTF-8 characters into
		 * wide-characters in the assumption that WCS is Unicode.
		 */
		if (n < 0) {
			n *= -1;
			wc = L'?';
		} else
			wc = (wchar_t)unicode;

		s += n;
		len -= n;
		/*
		 * Translates the wide-character into the current locale MBS.
		 */
#if HAVE_WCRTOMB
		n = (int)wcrtomb(p, wc, &shift_state);
#else
		n = (int)wctomb(p, wc);
#endif
		if (n == -1)
			return (-1);
		p += n;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (0);
}